

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

bool __thiscall
flatbuffers::csharp::CSharpGenerator::SaveType
          (CSharpGenerator *this,string *defname,Namespace *ns,string *classcode,bool needs_includes
          ,IDLOptions *options)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  string *ns_00;
  bool bVar4;
  allocator<char> local_179;
  string local_178 [32];
  string local_158;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string namespace_name;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string code;
  IDLOptions *options_local;
  bool needs_includes_local;
  string *classcode_local;
  Namespace *ns_local;
  string *defname_local;
  CSharpGenerator *this_local;
  
  ns_00 = classcode;
  code.field_2._8_8_ = options;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    pcVar2 = BaseGenerator::FlatBuffersGeneratedWarning();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar2,&local_a1);
    std::operator+(&local_80,"// <auto-generated>\n//  ",&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_80,"\n// </auto-generated>\n\n");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    BaseGenerator::FullNamespace_abi_cxx11_
              ((string *)local_d8,(BaseGenerator *)0x42d368,(char *)ns,(Namespace *)ns_00);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&filename.field_2 + 8),"namespace ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&filename.field_2 + 8),"\n{\n\n");
      std::__cxx11::string::operator+=((string *)local_60,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    }
    if (needs_includes) {
      std::__cxx11::string::operator+=((string *)local_60,"using global::System;\n");
      std::__cxx11::string::operator+=
                ((string *)local_60,"using global::System.Collections.Generic;\n");
      std::__cxx11::string::operator+=((string *)local_60,"using global::Google.FlatBuffers;\n\n");
    }
    std::__cxx11::string::operator+=((string *)local_60,(string *)classcode);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_60,"\n}\n");
    }
    BaseGenerator::NamespaceDir_abi_cxx11_(&local_158,&this->super_BaseGenerator,ns,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_158,defname);
    std::__cxx11::string::~string((string *)&local_158);
    if ((*(byte *)(code.field_2._8_8_ + 0x10) & 1) != 0) {
      std::__cxx11::string::operator+=((string *)local_138,(string *)(code.field_2._8_8_ + 0x1f0));
    }
    uVar3 = std::__cxx11::string::empty();
    bVar4 = (uVar3 & 1) != 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_178,".cs",&local_179);
    }
    else {
      std::__cxx11::string::string(local_178,(string *)(code.field_2._8_8_ + 0x210));
    }
    std::__cxx11::string::operator+=((string *)local_138,local_178);
    std::__cxx11::string::~string(local_178);
    if (bVar4) {
      std::allocator<char>::~allocator(&local_179);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = SaveFile(pcVar2,(string *)local_60,false);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_60);
  }
  return this_local._7_1_;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, bool needs_includes,
                const IDLOptions &options) const {
    if (!classcode.length()) return true;

    std::string code =
        "// <auto-generated>\n"
        "//  " +
        std::string(FlatBuffersGeneratedWarning()) +
        "\n"
        "// </auto-generated>\n\n";

    std::string namespace_name = FullNamespace(".", ns);
    if (!namespace_name.empty()) {
      code += "namespace " + namespace_name + "\n{\n\n";
    }
    if (needs_includes) {
      code += "using global::System;\n";
      code += "using global::System.Collections.Generic;\n";
      code += "using global::Google.FlatBuffers;\n\n";
    }
    code += classcode;
    if (!namespace_name.empty()) { code += "\n}\n"; }
    auto filename = NamespaceDir(ns) + defname;
    if (options.one_file) { filename += options.filename_suffix; }
    filename +=
        options.filename_extension.empty() ? ".cs" : options.filename_extension;
    return SaveFile(filename.c_str(), code, false);
  }